

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::WildcardPortConnectionSyntax::setChild
          (WildcardPortConnectionSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *this_00;
  long in_RSI;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_RDI;
  Token TVar1;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *this_01;
  pointer local_30;
  Info *local_28;
  SyntaxNode *local_20;
  Info *local_18;
  
  this_01 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&stack0x00000008;
  if (in_RSI == 0) {
    this_00 = TokenOrSyntax::node((TokenOrSyntax *)0x25933a);
    SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>(this_00);
    SyntaxList<slang::syntax::AttributeInstanceSyntax>::operator=(in_RDI,this_01);
  }
  else if (in_RSI == 1) {
    TVar1 = ConstTokenOrSyntax::token((ConstTokenOrSyntax *)this_01);
    local_20 = TVar1._0_8_;
    in_RDI[1].super_SyntaxListBase.super_SyntaxNode.previewNode = local_20;
    local_18 = TVar1.info;
    in_RDI[1].super_SyntaxListBase.childCount = (size_t)local_18;
  }
  else {
    TVar1 = ConstTokenOrSyntax::token((ConstTokenOrSyntax *)this_01);
    local_30 = TVar1._0_8_;
    in_RDI[1].super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
         local_30;
    local_28 = TVar1.info;
    in_RDI[1].super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent
    ._M_extent_value = (size_t)local_28;
  }
  return;
}

Assistant:

void WildcardPortConnectionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: dot = child.token(); return;
        case 2: star = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}